

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O0

Status * __thiscall leveldb::Status::operator=(Status *this,Status *rhs)

{
  long *in_RSI;
  Status *in_RDI;
  char *local_28;
  char *state;
  
  if (in_RDI->state_ != (char *)*in_RSI) {
    state = in_RDI->state_;
    if (state != (char *)0x0) {
      operator_delete__(state);
    }
    if (*in_RSI == 0) {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = CopyState(state);
    }
    in_RDI->state_ = local_28;
  }
  return in_RDI;
}

Assistant:

inline Status& Status::operator=(const Status& rhs) {
  // The following condition catches both aliasing (when this == &rhs),
  // and the common case where both rhs and *this are ok.
  if (state_ != rhs.state_) {
    delete[] state_;
    state_ = (rhs.state_ == nullptr) ? nullptr : CopyState(rhs.state_);
  }
  return *this;
}